

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_sdot_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  uintptr_t i;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar2 = (ulong)uVar1;
  for (uVar3 = 0; uVar1 >> 3 != uVar3; uVar3 = uVar3 + 1) {
    *(long *)((long)vd + uVar3 * 8) =
         (long)*(short *)((long)vm + uVar3 * 8 + 4) * (long)*(short *)((long)vn + uVar3 * 8 + 4) +
         (long)*(short *)((long)vm + uVar3 * 8 + 2) * (long)*(short *)((long)vn + uVar3 * 8 + 2) +
         (long)*(short *)((long)vm + uVar3 * 8) * (long)*(short *)((long)vn + uVar3 * 8) +
         *(long *)((long)vd + uVar3 * 8) +
         (long)*(short *)((long)vm + uVar3 * 8 + 6) * (long)*(short *)((long)vn + uVar3 * 8 + 6);
  }
  for (; uVar2 < (desc >> 2 & 0xf8) + 8; uVar2 = uVar2 + 8) {
    *(undefined8 *)((long)vd + uVar2) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd;
    int16_t *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        d[i] += (int64_t)n[i * 4 + 0] * m[i * 4 + 0]
              + (int64_t)n[i * 4 + 1] * m[i * 4 + 1]
              + (int64_t)n[i * 4 + 2] * m[i * 4 + 2]
              + (int64_t)n[i * 4 + 3] * m[i * 4 + 3];
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}